

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::eliminate_reshape_after_global_pooling(NetOptimize *this)

{
  int iVar1;
  int iVar2;
  value_type pLVar3;
  value_type pLVar4;
  bool bVar5;
  size_type sVar6;
  reference ppLVar7;
  reference pvVar8;
  size_type sVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  reference pvVar12;
  long in_RDI;
  int top_blob_index_final;
  Reshape *reshape;
  size_t j;
  int top_blob_index;
  Pooling *pooling;
  size_t i;
  size_t layer_count;
  char *in_stack_ffffffffffffff98;
  FILE *in_stack_ffffffffffffffa0;
  size_type local_30;
  size_type local_18;
  
  sVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  local_18 = 0;
  do {
    if (sVar6 <= local_18) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_18);
    bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (!bVar5) {
      ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_18);
      pLVar3 = *ppLVar7;
      if (*(int *)((long)&pLVar3[1].userdata + 4) != 0) {
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_18);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->tops,0);
        iVar1 = *pvVar8;
        local_30 = local_18;
        do {
          do {
            do {
              local_30 = local_30 + 1;
              if (sVar6 <= local_30) goto LAB_00187b6a;
              std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                         local_30);
              bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
            } while (bVar5);
            ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                  (in_RDI + 0x58),local_30);
            sVar9 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar7)->bottoms);
          } while (sVar9 != 1);
          ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_30);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->bottoms,0);
        } while (*pvVar8 != iVar1);
LAB_00187b6a:
        if (local_30 != sVar6) {
          ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_30);
          pLVar4 = *ppLVar7;
          if (((*(int *)((long)&pLVar4[1]._vptr_Layer + 4) == -0xe9) &&
              (iVar1._0_1_ = pLVar4[1].support_bf16_storage,
              iVar1._1_1_ = pLVar4[1].support_fp16_storage,
              iVar1._2_1_ = pLVar4[1].support_int8_storage,
              iVar1._3_1_ = pLVar4[1].support_image_storage, iVar1 == -0xe9)) &&
             (iVar2._0_1_ = pLVar4[1].support_tensor_storage,
             iVar2._1_1_ = pLVar4[1].support_reserved_00, iVar2._2_1_ = pLVar4[1].support_reserved_0
             , iVar2._3_1_ = pLVar4[1].support_reserved_1, iVar2 == 0)) {
            in_stack_ffffffffffffffa0 = _stderr;
            uVar10 = std::__cxx11::string::c_str();
            uVar11 = std::__cxx11::string::c_str();
            fprintf(in_stack_ffffffffffffffa0,"eliminate_reshape_after_global_pooling %s %s\n",
                    uVar10,uVar11);
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar4->tops,0);
            iVar1 = *pvVar8;
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar3->tops,0);
            *pvVar8 = iVar1;
            pvVar12 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)
                                  (in_RDI + 0x50),(long)iVar1);
            pvVar12->producer = (int)local_18;
            std::__cxx11::string::operator=((string *)&pLVar4->type,"ncnnfused");
          }
        }
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_reshape_after_global_pooling()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Pooling")
            continue;

        ncnn::Pooling* pooling = (ncnn::Pooling*)layers[i];
        if (pooling->global_pooling == 0)
            continue;

        // Pooling - Reshape
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Reshape")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Reshape* reshape = (ncnn::Reshape*)layers[j];
        if (reshape->h != -233 || reshape->c != -233 || reshape->permute != 0)
            continue;

        fprintf(stderr, "eliminate_reshape_after_global_pooling %s %s\n", pooling->name.c_str(), reshape->name.c_str());

        int top_blob_index_final = reshape->tops[0];
        pooling->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        reshape->type = "ncnnfused";
    }

    return 0;
}